

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

bool __thiscall wasm::EffectAnalyzer::hasAnything(EffectAnalyzer *this)

{
  bool bVar1;
  
  bVar1 = hasSideEffects(this);
  if ((!bVar1) &&
     ((this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count +
      (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    bVar1 = readsMutableGlobalState(this);
    return bVar1;
  }
  return true;
}

Assistant:

bool hasAnything() const {
    return hasSideEffects() || accessesLocal() || readsMutableGlobalState();
  }